

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O3

int http_client_execute(http_client *client,http_message *response)

{
  tcp_client *client_00;
  ushort uVar1;
  __int32_t *p_Var2;
  size_t sVar3;
  http_message *phVar4;
  char *pcVar5;
  size_t sVar6;
  __int32_t **pp_Var7;
  ulong uVar8;
  long lVar9;
  uint16_t uVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  char *pcVar14;
  size_t *psVar15;
  http_parser_url hp;
  char proto [16];
  http_parser_url local_70;
  http_parser *local_50;
  byte local_48 [24];
  
  http_message_init(response);
  client->response = response;
  pcVar14 = (client->request->url).p;
  sVar12 = (client->request->url).len;
  http_parser_url_init(&local_70);
  http_parser_parse_url(pcVar14,sVar12,0,&local_70);
  uVar10 = 0x50;
  if (local_70.port != 0) {
    uVar10 = local_70.port;
  }
  client->port = uVar10;
  if (((byte)local_70.field_set & 0x10) != 0) {
    memcpy(client->query_buffer + client->query_buffer_used,pcVar14 + local_70.field_data[4].off,
           (ulong)local_70.field_data[4].len);
    client->query_buffer_used = client->query_buffer_used + (ulong)local_70.field_data[4].len;
  }
  phVar4 = client->request;
  if (phVar4->query->nqueries != 0) {
    sVar12 = client->query_buffer_used;
    sVar3 = uri_query_build(phVar4->query,client->query_buffer + sVar12,0xc80 - sVar12);
    client->query_buffer_used = sVar3 + sVar12;
    phVar4 = client->request;
  }
  uVar1 = phVar4->method;
  pcVar5 = http_method_str((uint)uVar1);
  sVar6 = strlen(pcVar5);
  memcpy((client->request_buffer).p + client->request_buffer_used,pcVar5,sVar6);
  sVar12 = sVar6 + client->request_buffer_used;
  client->request_buffer_used = sVar12;
  (client->request_buffer).p[sVar12] = ' ';
  sVar12 = client->request_buffer_used + 1;
  client->request_buffer_used = sVar12;
  if (((byte)local_70.field_set & 8) != 0) {
    memcpy((client->request_buffer).p + sVar12,pcVar14 + local_70.field_data[3].off,
           (ulong)local_70.field_data[3].len);
    sVar12 = (ulong)local_70.field_data[3].len + client->request_buffer_used;
    client->request_buffer_used = sVar12;
  }
  if (uVar1 == 1) {
    (client->request_buffer).p[sVar12] = '?';
    sVar12 = client->request_buffer_used + 1;
    client->request_buffer_used = sVar12;
    sVar6 = client->query_buffer_used;
    memcpy((client->request_buffer).p + sVar12,client->query_buffer,sVar6);
    sVar12 = sVar6 + client->request_buffer_used;
    client->request_buffer_used = sVar12;
  }
  else {
    client->request->content_length = client->query_buffer_used;
    snprintf(_prepare_resquest_number_text,0x10,"%zd");
    http_message_add_header(client->request,"Content-Length",_prepare_resquest_number_text);
    http_message_add_header(client->request,"Content-Type","application/x-www-form-urlencoded");
    sVar12 = client->request_buffer_used;
  }
  (client->request_buffer).p[sVar12] = ' ';
  sVar12 = client->request_buffer_used + 1;
  client->request_buffer_used = sVar12;
  uVar13 = (ulong)local_70.field_data[0].len;
  if (local_70.field_data[0].len == 0) {
    uVar8 = 0;
  }
  else {
    pp_Var7 = __ctype_toupper_loc();
    p_Var2 = *pp_Var7;
    uVar11 = 0;
    do {
      local_48[uVar11] = *(byte *)(p_Var2 + pcVar14[uVar11 + local_70.field_data[0].off]);
      uVar11 = uVar11 + 1;
      uVar8 = uVar13;
    } while (uVar13 != uVar11);
  }
  local_48[uVar8] = 0x2f;
  local_48[uVar13 + 1] =
       (char)client->http_major + ((byte)(client->http_major / 5) & 0xfe) * -5 | 0x30;
  local_48[uVar13 + 2] = 0x2e;
  local_48[uVar13 + 3] =
       (char)client->http_minor + ((byte)(client->http_minor / 5) & 0xfe) * -5 | 0x30;
  memcpy((client->request_buffer).p + sVar12,local_48,uVar13 + 4);
  sVar12 = uVar13 + 4 + client->request_buffer_used;
  client->request_buffer_used = sVar12;
  pcVar5 = (client->request_buffer).p + sVar12;
  pcVar5[0] = '\r';
  pcVar5[1] = '\n';
  sVar12 = client->request_buffer_used;
  sVar3 = sVar12 + 2;
  client->request_buffer_used = sVar3;
  if (((byte)local_70.field_set & 2) != 0) {
    builtin_strncpy((client->request_buffer).p + sVar12 + 2,"Host: ",6);
    sVar12 = client->request_buffer_used + 6;
    client->request_buffer_used = sVar12;
    uVar13 = (ulong)local_70.field_data[1].len;
    memcpy((client->request_buffer).p + sVar12,pcVar14 + local_70.field_data[1].off,uVar13);
    client->request_buffer_used = client->request_buffer_used + uVar13;
    memcpy(client->host,pcVar14 + local_70.field_data[1].off,uVar13);
    pcVar14 = (client->request_buffer).p + client->request_buffer_used;
    pcVar14[0] = '\r';
    pcVar14[1] = '\n';
    sVar3 = client->request_buffer_used + 2;
    client->request_buffer_used = sVar3;
  }
  if (client->request->nheaders != 0) {
    psVar15 = &client->request->header_values[0].len;
    uVar13 = 0;
    do {
      sVar6 = psVar15[-0x40];
      memcpy((client->request_buffer).p + sVar3,(void *)psVar15[-0x41],sVar6);
      sVar12 = sVar6 + client->request_buffer_used;
      client->request_buffer_used = sVar12;
      pcVar14 = (client->request_buffer).p + sVar12;
      pcVar14[0] = ':';
      pcVar14[1] = ' ';
      sVar12 = client->request_buffer_used + 2;
      client->request_buffer_used = sVar12;
      sVar6 = *psVar15;
      memcpy((client->request_buffer).p + sVar12,((ss *)(psVar15 + -1))->p,sVar6);
      sVar12 = sVar6 + client->request_buffer_used;
      client->request_buffer_used = sVar12;
      pcVar14 = (client->request_buffer).p + sVar12;
      pcVar14[0] = '\r';
      pcVar14[1] = '\n';
      sVar3 = client->request_buffer_used + 2;
      client->request_buffer_used = sVar3;
      uVar13 = uVar13 + 1;
      psVar15 = psVar15 + 2;
    } while (uVar13 < client->request->nheaders);
  }
  pcVar14 = (client->request_buffer).p + sVar3;
  pcVar14[0] = '\r';
  pcVar14[1] = '\n';
  sVar12 = client->request_buffer_used + 2;
  client->request_buffer_used = sVar12;
  if ((client->request->method != 1) && (sVar6 = client->query_buffer_used, sVar6 != 0)) {
    memcpy((client->request_buffer).p + sVar12,client->query_buffer,sVar6);
    sVar12 = sVar6 + client->request_buffer_used;
    client->request_buffer_used = sVar12;
    pcVar14 = (client->request_buffer).p + sVar12;
    pcVar14[0] = '\r';
    pcVar14[1] = '\n';
    client->request_buffer_used = client->request_buffer_used + 2;
  }
  client_00 = &client->connector;
  tcp_client_connect(client_00,client->host,client->port);
  sVar12 = client->request_buffer_used;
  pcVar14 = (client->request_buffer).p;
  do {
    lVar9 = tcp_client_send(client_00,pcVar14,sVar12);
    if (lVar9 < 1) break;
    sVar12 = sVar12 - lVar9;
    pcVar14 = pcVar14 + lVar9;
  } while (0 < (long)sVar12);
  local_50 = &client->parser;
  http_parser_init(local_50,HTTP_RESPONSE);
  (client->parser).data = client;
  pcVar14 = (client->response_buffer).p;
  lVar9 = 0;
  do {
    sVar12 = tcp_client_recv(client_00,pcVar14,(client->response_buffer).len - lVar9);
    if ((long)sVar12 < 1) break;
    http_parser_execute(local_50,&client->settings,pcVar14,sVar12);
    lVar9 = lVar9 + sVar12;
    pcVar14 = pcVar14 + sVar12;
  } while (client->response_complete != true);
  tcp_client_close(client_00);
  return 0;
}

Assistant:

int http_client_execute(http_client* client, http_message* response)
{
    ssize_t nbytes = 0, count = 0, remains = 0;
    char* pos;

    http_message_init(response);
    client->response = response;
    _prepare_resquest(client);
    tcp_client_connect(&client->connector, client->host, client->port);

    count = 0;
    pos = (char*)client->request_buffer.p;
    remains = client->request_buffer_used;
    do {
        nbytes = tcp_client_send(&client->connector, pos, remains);
        remains -= nbytes;
        count += nbytes;
        pos += nbytes;
    } while (nbytes > 0 && remains > 0);

    LOGD("sent count: %ld\n", count);

    // parser reset
    http_parser_init(&client->parser, HTTP_RESPONSE);
    client->parser.data = client;

    count = 0;
    pos = (char*)client->response_buffer.p;
    do {
        nbytes = tcp_client_recv(&client->connector, pos,
                                 client->response_buffer.len - count);
        if (nbytes <= 0) break;
        http_parser_execute(&client->parser, &client->settings, pos, nbytes);
        count += nbytes;
        pos += nbytes;
    } while (!client->response_complete);
    LOGD("recv count: %ld\n", count);

    tcp_client_close(&client->connector);
    return 0;
}